

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O2

Box * __thiscall amrex::Box::refine(Box *this,int ref_ratio)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  if (ref_ratio != 1) {
    uVar1 = (this->btype).itype;
    (this->smallend).vect[0] = (this->smallend).vect[0] * ref_ratio;
    (this->smallend).vect[1] = (this->smallend).vect[1] * ref_ratio;
    (this->smallend).vect[2] = (this->smallend).vect[2] * ref_ratio;
    iVar2 = (this->bigend).vect[1];
    uVar4 = (uint)((uVar1 & 2) == 0);
    iVar3 = (this->bigend).vect[2];
    uVar5 = (uint)((uVar1 & 4) == 0);
    (this->bigend).vect[0] = ((this->bigend).vect[0] + (~uVar1 & 1)) * ref_ratio - (~uVar1 & 1);
    (this->bigend).vect[1] = (iVar2 + uVar4) * ref_ratio - uVar4;
    (this->bigend).vect[2] = (iVar3 + uVar5) * ref_ratio - uVar5;
  }
  return this;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    Box& refine (int ref_ratio) noexcept {
        return this->refine(IntVect(ref_ratio));
    }